

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

xmlBufPtr xmlBufCreateStatic(void *mem,size_t size)

{
  xmlBufPtr pxVar1;
  size_t sVar2;
  
  if (mem == (void *)0x0) {
    pxVar1 = (xmlBufPtr)0x0;
  }
  else {
    pxVar1 = (xmlBufPtr)(*xmlMalloc)(0x40);
    if (pxVar1 == (xmlBufPtr)0x0) {
      pxVar1 = (xmlBufPtr)0x0;
      __xmlSimpleError(0x1d,2,(xmlNodePtr)0x0,(char *)0x0,"creating buffer");
    }
    else {
      pxVar1->use = size;
      pxVar1->size = size;
      sVar2 = 0x7fffffff;
      if (size < 0x7fffffff) {
        sVar2 = size;
      }
      pxVar1->compat_size = (uint)sVar2;
      pxVar1->compat_use = (uint)sVar2;
      pxVar1->alloc = XML_BUFFER_ALLOC_IMMUTABLE;
      pxVar1->content = (xmlChar *)mem;
      pxVar1->error = 0;
      pxVar1->buffer = (xmlBufferPtr)0x0;
    }
  }
  return pxVar1;
}

Assistant:

xmlBufPtr
xmlBufCreateStatic(void *mem, size_t size) {
    xmlBufPtr ret;

    if (mem == NULL)
        return(NULL);

    ret = (xmlBufPtr) xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL) {
	xmlBufMemoryError(NULL, "creating buffer");
        return(NULL);
    }
    ret->use = size;
    ret->size = size;
    UPDATE_COMPAT(ret);
    ret->alloc = XML_BUFFER_ALLOC_IMMUTABLE;
    ret->content = (xmlChar *) mem;
    ret->error = 0;
    ret->buffer = NULL;
    return(ret);
}